

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void leaveblock(FuncState *fs)

{
  BlockCnt *bl_00;
  LexState *ls_00;
  int a;
  TString *name;
  int local_24;
  int stklevel;
  int hasclose;
  LexState *ls;
  BlockCnt *bl;
  FuncState *fs_local;
  
  bl_00 = fs->bl;
  ls_00 = fs->ls;
  local_24 = 0;
  a = reglevel(fs,(uint)bl_00->nactvar);
  removevars(fs,(uint)bl_00->nactvar);
  if (bl_00->isloop != '\0') {
    name = luaS_newlstr(ls_00->L,"break",5);
    local_24 = createlabel(ls_00,name,0,0);
  }
  if (((local_24 == 0) && (bl_00->previous != (BlockCnt *)0x0)) && (bl_00->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,a,0,0,0);
  }
  fs->freereg = (lu_byte)a;
  (ls_00->dyd->label).n = bl_00->firstlabel;
  fs->bl = bl_00->previous;
  if (bl_00->previous == (BlockCnt *)0x0) {
    if (bl_00->firstgoto < (ls_00->dyd->gt).n) {
      undefgoto(ls_00,(ls_00->dyd->gt).arr + bl_00->firstgoto);
    }
  }
  else {
    movegotosout(fs,bl_00);
  }
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  int hasclose = 0;
  int stklevel = reglevel(fs, bl->nactvar);  /* level outside the block */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop)  /* has to fix pending breaks? */
    hasclose = createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  if (!hasclose && bl->previous && bl->upval)  /* still need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
  fs->bl = bl->previous;  /* current block now is previous one */
  if (bl->previous)  /* was it a nested block? */
    movegotosout(fs, bl);  /* update pending gotos to enclosing block */
  else {
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
}